

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O2

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::pdf(extreme_value_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->P).theta_;
  fVar2 = (x - (this->P).eta_) / fVar1;
  fVar3 = expf(fVar2);
  fVar2 = expf(fVar2 - fVar3);
  return fVar2 / fVar1;
}

Assistant:

pdf(result_type x) const {
      x -= P.eta();
      x /= P.theta();
      return math::exp(x - math::exp(x)) / P.theta();
    }